

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

int insert(nghttp2_map_bucket *table,uint32_t tablelen,uint32_t tablelenbits,uint32_t hash,
          nghttp2_map_key_type key,void *data)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  nghttp2_map_bucket *pnVar6;
  ulong uVar7;
  void **ppvVar8;
  
  uVar5 = (ulong)(hash >> (-(char)tablelenbits & 0x1fU));
  pnVar6 = table + uVar5;
  pvVar4 = table[uVar5].data;
  if (pvVar4 != (void *)0x0) {
    ppvVar8 = &table[uVar5].data;
    uVar3 = 0;
    do {
      uVar1 = pnVar6->hash;
      iVar2 = pnVar6->key;
      uVar7 = (ulong)((int)uVar5 - (uVar1 >> (0x20U - (char)tablelenbits & 0x1f)) & tablelen - 1);
      if (uVar7 < uVar3) {
        pnVar6->hash = hash;
        pnVar6->key = key;
        *ppvVar8 = data;
        uVar3 = uVar7;
        data = pvVar4;
        key = iVar2;
        hash = uVar1;
      }
      else if (iVar2 == key) {
        return -0x1f5;
      }
      uVar3 = uVar3 + 1;
      uVar5 = (ulong)((int)uVar5 + 1U & tablelen - 1);
      pnVar6 = table + uVar5;
      ppvVar8 = &table[uVar5].data;
      pvVar4 = *ppvVar8;
    } while (pvVar4 != (void *)0x0);
  }
  pnVar6->hash = hash;
  pnVar6->key = key;
  pnVar6->data = data;
  return 0;
}

Assistant:

static int insert(nghttp2_map_bucket *table, uint32_t tablelen,
                  uint32_t tablelenbits, uint32_t hash,
                  nghttp2_map_key_type key, void *data) {
  size_t idx = h2idx(hash, tablelenbits);
  size_t d = 0, dd;
  nghttp2_map_bucket *bkt;

  for (;;) {
    bkt = &table[idx];

    if (bkt->data == NULL) {
      map_bucket_set_data(bkt, hash, key, data);
      return 0;
    }

    dd = distance(tablelen, tablelenbits, bkt, idx);
    if (d > dd) {
      map_bucket_swap(bkt, &hash, &key, &data);
      d = dd;
    } else if (bkt->key == key) {
      /* TODO This check is just a waste after first swap or if this
         function is called from map_resize.  That said, there is no
         difference with or without this conditional in performance
         wise. */
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    ++d;
    idx = (idx + 1) & (tablelen - 1);
  }
}